

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O0

void __thiscall CardProdDiffInv::test_method(CardProdDiffInv *this)

{
  undefined8 uVar1;
  bool bVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_9b8;
  basic_cstring<const_char> local_9a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_998;
  double local_978;
  assertion_result local_970;
  basic_cstring<const_char> local_958;
  basic_cstring<const_char> local_948;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_938;
  Matrix<double,__1,__1,_0,__1,__1> local_910;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_8f8;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_8d0;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_8a8 [24];
  Scalar local_890;
  Scalar local_888;
  Scalar local_880;
  Scalar local_878;
  Scalar local_870;
  Scalar local_868;
  Scalar local_860;
  Scalar local_858;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_850;
  int local_82c;
  undefined1 local_828 [8];
  VectorXd v;
  EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_6f0 [24];
  undefined1 local_6d8 [8];
  VectorXd x;
  Scalar local_6c0;
  Scalar local_6b8;
  Scalar local_6b0;
  Scalar local_6a8;
  Scalar local_6a0;
  Scalar local_698;
  Scalar local_690;
  Scalar local_688;
  Scalar local_680;
  Scalar local_678;
  Scalar local_670;
  Scalar local_668;
  Scalar local_660;
  Scalar local_658;
  Scalar local_650;
  Scalar local_648;
  Scalar local_640;
  Scalar local_638;
  Scalar local_630;
  Scalar local_628;
  Scalar local_620;
  Scalar local_618;
  Scalar local_610;
  Scalar local_608;
  Scalar local_600;
  Scalar local_5f8;
  Scalar local_5f0;
  Scalar local_5e8;
  Scalar local_5e0;
  Scalar local_5d8;
  Scalar local_5d0;
  Scalar local_5c8;
  Scalar local_5c0;
  Scalar local_5b8;
  Scalar local_5b0;
  Scalar local_5a8;
  Scalar local_5a0;
  Scalar local_598;
  Scalar local_590;
  Scalar local_588;
  Scalar local_580;
  Scalar local_578;
  Scalar local_570;
  Scalar local_568;
  Scalar local_560;
  Scalar local_558;
  Scalar local_550;
  Scalar local_548;
  Scalar local_540;
  Scalar local_538;
  Scalar local_530;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  Scalar local_510;
  Scalar local_508;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  Scalar local_4e8;
  Scalar local_4e0;
  Scalar local_4d8;
  Scalar local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  Scalar local_4b0;
  Scalar local_4a8;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  Scalar local_488;
  Scalar local_480;
  Scalar local_478;
  Scalar local_470;
  Scalar local_468;
  Scalar local_460;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  Scalar local_410;
  Scalar local_408;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  Scalar local_3e8;
  Scalar local_3e0;
  Scalar local_3d8;
  Scalar local_3d0;
  Scalar local_3c8;
  Scalar local_3c0;
  Scalar local_3b8;
  Scalar local_3b0;
  Scalar local_3a8;
  Scalar local_3a0;
  Scalar local_398;
  Scalar local_390;
  Scalar local_388;
  Scalar local_380;
  Scalar local_378;
  Scalar local_370;
  Scalar local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_348;
  int local_328 [2];
  undefined1 local_320 [8];
  MatrixXd Jtest;
  MatrixXd J;
  CartesianProduct S;
  CartesianProduct local_250 [8];
  CartesianProduct R2SO3;
  undefined1 local_1b0 [8];
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace local_100 [8];
  RealSpace R3;
  RealSpace local_88 [8];
  RealSpace R2;
  CardProdDiffInv *this_local;
  
  mnf::RealSpace::RealSpace(local_88,2);
  mnf::RealSpace::RealSpace(local_100,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3((SO3<mnf::ExpMapMatrix> *)local_1b0);
  mnf::CartesianProduct::CartesianProduct(local_250,(Manifold *)local_88,(Manifold *)local_1b0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)
             &J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (Manifold *)local_250,(Manifold *)local_100);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  local_328[1] = 8;
  local_328[0] = 0xe;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_320,local_328 + 1,local_328);
  local_350 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_348,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_320,&local_350
            );
  local_358 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_348,&local_358);
  local_360 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_360);
  local_368 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_368);
  local_370 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_370);
  local_378 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_378);
  local_380 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_380);
  local_388 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_388);
  local_390 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_390);
  local_398 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_398);
  local_3a0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3a0);
  local_3a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3a8);
  local_3b0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3b0);
  local_3b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3b8);
  local_3c0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3c0);
  local_3c8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3c8);
  local_3d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3d0);
  local_3d8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3d8);
  local_3e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3e0);
  local_3e8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3e8);
  local_3f0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3f0);
  local_3f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_3f8);
  local_400 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_400);
  local_408 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_408);
  local_410 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_410);
  local_418 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_418);
  local_420 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_420);
  local_428 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_428);
  local_430 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_430);
  local_438 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_438);
  local_440 = -0.064043491813865;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_440);
  local_448 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_448);
  local_450 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_450);
  local_458 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_458);
  local_460 = -0.064043491813865;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_460);
  local_468 = 0.545030346992499;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_468);
  local_470 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_470);
  local_478 = -0.545030346992499;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_478);
  local_480 = -0.064043491813865;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_480);
  local_488 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_488);
  local_490 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_490);
  local_498 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_498);
  local_4a0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4a0);
  local_4a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4a8);
  local_4b0 = -0.110117993664377;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4b0);
  local_4b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4b8);
  local_4c0 = -0.545030346992499;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4c0);
  local_4c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4c8);
  local_4d0 = -0.110117993664377;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4d0);
  local_4d8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4d8);
  local_4e0 = 0.545030346992499;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4e0);
  local_4e8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4e8);
  local_4f0 = -0.110117993664377;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4f0);
  local_4f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_4f8);
  local_500 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_500);
  local_508 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_508);
  local_510 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_510);
  local_518 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_518);
  local_520 = -0.042109988599266;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_520);
  local_528 = 0.545030346992499;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_528);
  local_530 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_530);
  local_538 = -0.545030346992499;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_538);
  local_540 = -0.042109988599266;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_540);
  local_548 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_548);
  local_550 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_550);
  local_558 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_558);
  local_560 = -0.042109988599266;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_560);
  local_568 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_568);
  local_570 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_570);
  local_578 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_578);
  local_580 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_580);
  local_588 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_588);
  local_590 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_590);
  local_598 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_598);
  local_5a0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5a0);
  local_5a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5a8);
  local_5b0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5b0);
  local_5b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5b8);
  local_5c0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5c0);
  local_5c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5c8);
  local_5d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5d0);
  local_5d8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5d8);
  local_5e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5e0);
  local_5e8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5e8);
  local_5f0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5f0);
  local_5f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_5f8);
  local_600 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_600);
  local_608 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_608);
  local_610 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_610);
  local_618 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_618);
  local_620 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_620);
  local_628 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_628);
  local_630 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_630);
  local_638 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_638);
  local_640 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_640);
  local_648 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_648);
  local_650 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_650);
  local_658 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_658);
  local_660 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_660);
  local_668 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_668);
  local_670 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_670);
  local_678 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_678);
  local_680 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_680);
  local_688 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_688);
  local_690 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_690);
  local_698 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_698);
  local_6a0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_6a0);
  local_6a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_6a8);
  local_6b0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_6b0);
  local_6b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_6b8);
  local_6c0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_6c0);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar3,(Scalar *)
                    &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_348);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_6d8,local_6f0);
  mnf::Point::~Point((Point *)&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows);
  local_82c = 8;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_828,&local_82c);
  local_858 = 243.27432598;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_850,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_828,&local_858);
  local_860 = -2314327.23748;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_850,&local_860);
  local_868 = 0.3403857;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_868);
  local_870 = 0.58526775;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_870);
  local_878 = 0.223811;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_878);
  local_880 = 3.08;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_880);
  local_888 = 1e-08;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar4,&local_888);
  local_890 = 232.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar4,&local_890);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_850);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_8a8,(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6d8,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_8d0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6d8,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_8f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_828,(type *)0x0);
  mnf::Manifold::retractation
            (&J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             local_8a8,&local_8d0,&local_8f8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_8f8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_8d0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_938,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6d8,(type *)0x0);
  mnf::Manifold::diffPseudoLog0((Ref_conflict *)&local_910);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,&local_910);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_910);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_938);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_948,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_958);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_948,0x188,&local_958);
    local_978 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            isApprox<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_320,&local_978)
    ;
    boost::test_tools::assertion_result::assertion_result(&local_970,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a8,"J.isApprox(Jtest)",0x11);
    boost::unit_test::operator<<(&local_998,prev,&local_9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_970,&local_998,&local_9b8,0x188,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_998);
    boost::test_tools::assertion_result::~assertion_result(&local_970);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_828);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_6d8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_320);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  mnf::CartesianProduct::~CartesianProduct
            ((CartesianProduct *)
             &J.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  mnf::CartesianProduct::~CartesianProduct(local_250);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3((SO3<mnf::ExpMapMatrix> *)local_1b0);
  mnf::RealSpace::~RealSpace(local_100);
  mnf::RealSpace::~RealSpace(local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdDiffInv)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct R2SO3(R2, RotSpace);
  CartesianProduct S(R2SO3, R3);
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(8, 14);
  Jtest << 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, -0.064043491813865, 0, 0, 0, -0.064043491813865,
      0.545030346992499, 0, -0.545030346992499, -0.064043491813865, 0, 0, 0, 0,
      0, -0.110117993664377, 0, -0.545030346992499, 0, -0.110117993664377, 0,
      0.545030346992499, 0, -0.110117993664377, 0, 0, 0, 0, 0,
      -0.042109988599266, 0.545030346992499, 0, -0.545030346992499,
      -0.042109988599266, 0, 0, 0, -0.042109988599266, 0, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1;
  Eigen::VectorXd x = S.getZero().value();
  Eigen::VectorXd v(8);
  v << 243.27432598, -2314327.23748, 0.3403857, 0.58526775, 0.223811, 3.08,
      0.00000001, 232.5;
  S.retractation(x, x, v);
  J = S.diffPseudoLog0(x);
  BOOST_CHECK(J.isApprox(Jtest));
}